

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units_decl.hpp
# Opt level: O0

bool __thiscall units::detail::unit_data::operator==(unit_data *this,unit_data *other)

{
  bool bVar1;
  unit_data *in_RSI;
  unit_data *in_RDI;
  bool local_11;
  
  bVar1 = equivalent_non_counting(in_RDI,in_RSI);
  local_11 = false;
  if ((((bVar1) &&
       (local_11 = false, ((int)*in_RDI << 0xb) >> 0x1e == ((int)*in_RSI << 0xb) >> 0x1e)) &&
      (local_11 = false, ((int)*in_RDI << 4) >> 0x1e == ((int)*in_RSI << 4) >> 0x1e)) &&
     (((local_11 = false, ((int)*in_RDI << 8) >> 0x1d == ((int)*in_RSI << 8) >> 0x1d &&
       (local_11 = false, ((uint)*in_RDI >> 0x1c & 1) == ((uint)*in_RSI >> 0x1c & 1))) &&
      ((local_11 = false, ((uint)*in_RDI >> 0x1d & 1) == ((uint)*in_RSI >> 0x1d & 1) &&
       (local_11 = false, ((uint)*in_RDI >> 0x1e & 1) == ((uint)*in_RSI >> 0x1e & 1))))))) {
    local_11 = (uint)*in_RDI >> 0x1f == (uint)*in_RSI >> 0x1f;
  }
  return local_11;
}

Assistant:

constexpr bool operator==(const unit_data& other) const
        {
            return equivalent_non_counting(other) && mole_ == other.mole_ &&
                count_ == other.count_ && radians_ == other.radians_ &&
                per_unit_ == other.per_unit_ && i_flag_ == other.i_flag_ &&
                e_flag_ == other.e_flag_ && equation_ == other.equation_;
        }